

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O2

void __thiscall Robot::setdimensionsABB(Robot *this)

{
  *(undefined4 *)&this->a1z = 0;
  *(undefined4 *)((long)&this->a1z + 4) = 0;
  *(undefined4 *)&this->a2x = 0;
  *(undefined4 *)((long)&this->a2x + 4) = 0x4065e000;
  this->a2z = 495.0;
  this->a3z = 1095.0;
  this->a4x = 1230.5;
  this->a4z = 175.0;
  *(undefined4 *)&this->a5x = 0;
  *(undefined4 *)((long)&this->a5x + 4) = 0;
  *(undefined4 *)&this->a6x = 0;
  *(undefined4 *)((long)&this->a6x + 4) = 0x40554000;
  this->brand = ABB;
  return;
}

Assistant:

void Robot::setdimensionsABB(void){
    this->a1z = 0.0;
    this->a2x = 175.0;
    this->a2z = 495.0;
    this->a3z = 1095.0;
    this->a4x = 1230.5;
    this->a4z = 175.0;
    this->a5x = 0.0;
    this->a6x = 85.0;
    this->brand = ABB;
}